

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

string * __thiscall
Utils::getClsidType_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  string *psVar1;
  clsid_type *pcVar2;
  bool bVar3;
  clsid_type *__lhs;
  allocator local_71;
  string *local_70;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  string local_50;
  
  pcVar2 = clsid_list;
  local_70 = __return_storage_ptr__;
  do {
    __lhs = pcVar2;
    bVar3 = std::operator!=(&__lhs->clsid,anon_var_dwarf_232c7);
    psVar1 = local_70;
    if (!bVar3) {
      std::__cxx11::string::string((string *)local_70,"Not found",&local_71);
      return psVar1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
    bVar3 = compareClsidType((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
                             &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
    psVar1 = local_70;
    pcVar2 = __lhs + 1;
  } while (!bVar3);
  std::__cxx11::string::string((string *)local_70,(string *)&__lhs->name);
  return psVar1;
}

Assistant:

std::string Utils::getClsidType(std::vector<unsigned int> vec) {
    for (int i = 0; clsid_list[i].clsid != GUID_Unknown; i++) {
        if (compareClsidType(vec, clsid_list[i].clsid)) {
            return clsid_list[i].name;
        }
    }
    return "Not found";
}